

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

uchar * header_bytes(archive_read *a,size_t rbytes)

{
  ssize_t sVar1;
  uLong uVar2;
  ssize_t bytes;
  void *buff;
  uchar *p;
  _7zip *zip;
  size_t rbytes_local;
  archive_read *a_local;
  
  p = (uchar *)a->format->data;
  if (*(ulong *)(p + 0x70) < rbytes) {
    a_local = (archive_read *)0x0;
  }
  else {
    zip = (_7zip *)rbytes;
    rbytes_local = (size_t)a;
    if (*(long *)(p + 0x120) != 0) {
      read_consume(a);
    }
    if (*(int *)(p + 0x6c) == 0) {
      buff = __archive_read_ahead((archive_read *)rbytes_local,(size_t)zip,(ssize_t *)0x0);
      if (buff == (void *)0x0) {
        return (uchar *)0x0;
      }
      *(long *)(p + 0x70) = *(long *)(p + 0x70) - (long)zip;
      *(_7zip **)(p + 0x120) = zip;
    }
    else {
      sVar1 = read_stream((archive_read *)rbytes_local,(void **)&bytes,(size_t)zip,(size_t)zip);
      if (sVar1 < 1) {
        return (uchar *)0x0;
      }
      *(long *)(p + 0x70) = *(long *)(p + 0x70) - sVar1;
      buff = (void *)bytes;
    }
    uVar2 = cm_zlib_z_crc32(*(unsigned_long *)(p + 0x78),(uchar *)buff,(uInt)zip);
    *(uLong *)(p + 0x78) = uVar2;
    a_local = (archive_read *)buff;
  }
  return (uchar *)a_local;
}

Assistant:

static const unsigned char *
header_bytes(struct archive_read *a, size_t rbytes)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;

	if (zip->header_bytes_remaining < rbytes)
		return (NULL);
	if (zip->pack_stream_bytes_unconsumed)
		read_consume(a);

	if (zip->header_is_encoded == 0) {
		p = __archive_read_ahead(a, rbytes, NULL);
		if (p == NULL)
			return (NULL);
		zip->header_bytes_remaining -= rbytes;
		zip->pack_stream_bytes_unconsumed = rbytes;
	} else {
		const void *buff;
		ssize_t bytes;

		bytes = read_stream(a, &buff, rbytes, rbytes);
		if (bytes <= 0)
			return (NULL);
		zip->header_bytes_remaining -= bytes;
		p = buff;
	}

	/* Update checksum */
	zip->header_crc32 = crc32(zip->header_crc32, p, (unsigned)rbytes);
	return (p);
}